

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O1

int __thiscall
Context::clone(Context *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  undefined8 *puVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  long local_78;
  long local_70;
  long local_68;
  string local_60;
  shared_ptr<RuntimeSymbol> local_40;
  
  Context(this);
  lVar4 = *(long *)(__fn + 0x10);
  if (lVar4 != *(long *)(__fn + 0x30)) {
    local_78 = *(long *)(__fn + 0x28);
    local_68 = *(long *)(__fn + 0x18);
    local_70 = *(long *)(__fn + 0x20);
    do {
      for (puVar5 = *(undefined8 **)(lVar4 + 0x10); puVar5 != (undefined8 *)0x0;
          puVar5 = (undefined8 *)*puVar5) {
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_60,puVar5[1],puVar5[2] + puVar5[1]);
        (**(code **)(*(long *)puVar5[5] + 0x18))(&local_40,(long *)puVar5[5],this);
        addSymbol(this,&local_60,&local_40);
        if (local_40.super___shared_ptr<RuntimeSymbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_40.super___shared_ptr<RuntimeSymbol,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      lVar2 = lVar4 - local_68 >> 3;
      uVar1 = lVar2 * 0x6db6db6db6db6db7 + 1;
      if (uVar1 < 9) {
        lVar2 = lVar4 + 0x38;
      }
      else {
        if (lVar4 - local_68 < -0x37) {
          uVar3 = ~((lVar2 * -0x6db6db6db6db6db7 - 2U) / 9);
        }
        else {
          uVar3 = uVar1 / 9;
        }
        lVar2 = uVar1 * 0x38 + uVar3 * -0x1f8 + *(long *)(local_78 + uVar3 * 8);
      }
      if (lVar2 != *(long *)(__fn + 0x30)) {
        enterScope(this);
      }
      lVar4 = lVar4 + 0x38;
      if (lVar4 == local_70) {
        lVar4 = *(long *)(local_78 + 8);
        local_78 = local_78 + 8;
        local_70 = lVar4 + 0x1f8;
        local_68 = lVar4;
      }
    } while (lVar4 != *(long *)(__fn + 0x30));
  }
  return (int)this;
}

Assistant:

Context Context::clone() const
{
  Context newContext{};
  for(auto scopesIt = scopes_.cbegin(); scopesIt != scopes_.cend(); ++scopesIt)
  {
    for(const auto& symbol : *scopesIt)
    {
      const auto name = symbol.first;
      newContext.addSymbol(name, symbol.second->clone(newContext));
    }

    if(scopesIt + 1 != scopes_.cend())
      newContext.enterScope();
  }
  return newContext;
}